

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O0

SmallVectorImpl<int> * __thiscall
tf::SmallVectorImpl<int>::operator=(SmallVectorImpl<int> *this,SmallVectorImpl<int> *RHS)

{
  bool bVar1;
  iterator piVar2;
  iterator piVar3;
  iterator MinSize;
  iterator piVar4;
  iterator piVar5;
  int *local_38;
  iterator NewEnd;
  size_t CurSize;
  size_t RHSSize;
  SmallVectorImpl<int> *RHS_local;
  SmallVectorImpl<int> *this_local;
  
  if (this != RHS) {
    bVar1 = SmallVectorTemplateCommon<int,_void>::isSmall
                      ((SmallVectorTemplateCommon<int,_void> *)RHS);
    if (bVar1) {
      MinSize = (iterator)
                SmallVectorTemplateCommon<int,_void>::size
                          ((SmallVectorTemplateCommon<int,_void> *)RHS);
      NewEnd = (iterator)
               SmallVectorTemplateCommon<int,_void>::size
                         ((SmallVectorTemplateCommon<int,_void> *)this);
      if (NewEnd < MinSize) {
        piVar4 = (iterator)
                 SmallVectorTemplateCommon<int,_void>::capacity
                           ((SmallVectorTemplateCommon<int,_void> *)this);
        if (piVar4 < MinSize) {
          piVar2 = SmallVectorTemplateCommon<int,_void>::begin
                             ((SmallVectorTemplateCommon<int,_void> *)this);
          piVar3 = SmallVectorTemplateCommon<int,_void>::end
                             ((SmallVectorTemplateCommon<int,_void> *)this);
          SmallVectorTemplateBase<int,_true>::destroy_range(piVar2,piVar3);
          piVar2 = SmallVectorTemplateCommon<int,_void>::begin
                             ((SmallVectorTemplateCommon<int,_void> *)this);
          SmallVectorTemplateCommon<int,_void>::setEnd
                    ((SmallVectorTemplateCommon<int,_void> *)this,piVar2);
          NewEnd = (iterator)0x0;
          SmallVectorTemplateBase<int,_true>::grow
                    (&this->super_SmallVectorTemplateBase<int,_true>,(size_t)MinSize);
        }
        else if (NewEnd != (iterator)0x0) {
          piVar2 = SmallVectorTemplateCommon<int,_void>::begin
                             ((SmallVectorTemplateCommon<int,_void> *)RHS);
          piVar3 = SmallVectorTemplateCommon<int,_void>::begin
                             ((SmallVectorTemplateCommon<int,_void> *)RHS);
          piVar5 = SmallVectorTemplateCommon<int,_void>::begin
                             ((SmallVectorTemplateCommon<int,_void> *)this);
          std::move<int*,int*>(piVar2,piVar3 + (long)NewEnd,piVar5);
        }
        piVar2 = SmallVectorTemplateCommon<int,_void>::begin
                           ((SmallVectorTemplateCommon<int,_void> *)RHS);
        piVar3 = SmallVectorTemplateCommon<int,_void>::end
                           ((SmallVectorTemplateCommon<int,_void> *)RHS);
        piVar5 = SmallVectorTemplateCommon<int,_void>::begin
                           ((SmallVectorTemplateCommon<int,_void> *)this);
        SmallVectorTemplateBase<int,true>::uninitialized_move<int*,int*>
                  (piVar2 + (long)NewEnd,piVar3,piVar5 + (long)NewEnd);
        piVar2 = SmallVectorTemplateCommon<int,_void>::begin
                           ((SmallVectorTemplateCommon<int,_void> *)this);
        SmallVectorTemplateCommon<int,_void>::setEnd
                  ((SmallVectorTemplateCommon<int,_void> *)this,piVar2 + (long)MinSize);
        clear(RHS);
      }
      else {
        local_38 = SmallVectorTemplateCommon<int,_void>::begin
                             ((SmallVectorTemplateCommon<int,_void> *)this);
        if (MinSize != (iterator)0x0) {
          piVar2 = SmallVectorTemplateCommon<int,_void>::begin
                             ((SmallVectorTemplateCommon<int,_void> *)RHS);
          piVar3 = SmallVectorTemplateCommon<int,_void>::end
                             ((SmallVectorTemplateCommon<int,_void> *)RHS);
          local_38 = std::move<int*,int*>(piVar2,piVar3,local_38);
        }
        piVar2 = SmallVectorTemplateCommon<int,_void>::end
                           ((SmallVectorTemplateCommon<int,_void> *)this);
        SmallVectorTemplateBase<int,_true>::destroy_range(local_38,piVar2);
        SmallVectorTemplateCommon<int,_void>::setEnd
                  ((SmallVectorTemplateCommon<int,_void> *)this,local_38);
        clear(RHS);
      }
    }
    else {
      piVar2 = SmallVectorTemplateCommon<int,_void>::begin
                         ((SmallVectorTemplateCommon<int,_void> *)this);
      piVar3 = SmallVectorTemplateCommon<int,_void>::end
                         ((SmallVectorTemplateCommon<int,_void> *)this);
      SmallVectorTemplateBase<int,_true>::destroy_range(piVar2,piVar3);
      bVar1 = SmallVectorTemplateCommon<int,_void>::isSmall
                        ((SmallVectorTemplateCommon<int,_void> *)this);
      if (!bVar1) {
        piVar2 = SmallVectorTemplateCommon<int,_void>::begin
                           ((SmallVectorTemplateCommon<int,_void> *)this);
        free(piVar2);
      }
      (this->super_SmallVectorTemplateBase<int,_true>).super_SmallVectorTemplateCommon<int,_void>.
      super_SmallVectorBase.BeginX =
           (RHS->super_SmallVectorTemplateBase<int,_true>).
           super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.BeginX;
      (this->super_SmallVectorTemplateBase<int,_true>).super_SmallVectorTemplateCommon<int,_void>.
      super_SmallVectorBase.EndX =
           (RHS->super_SmallVectorTemplateBase<int,_true>).
           super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.EndX;
      (this->super_SmallVectorTemplateBase<int,_true>).super_SmallVectorTemplateCommon<int,_void>.
      super_SmallVectorBase.CapacityX =
           (RHS->super_SmallVectorTemplateBase<int,_true>).
           super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.CapacityX;
      SmallVectorTemplateCommon<int,_void>::resetToSmall
                ((SmallVectorTemplateCommon<int,_void> *)RHS);
    }
  }
  return this;
}

Assistant:

SmallVectorImpl<T> &SmallVectorImpl<T>::operator=(SmallVectorImpl<T> &&RHS) {
  // Avoid self-assignment.
  if (this == &RHS) return *this;

  // If the RHS isn't small, clear this vector and then steal its buffer.
  if (!RHS.isSmall()) {
    this->destroy_range(this->begin(), this->end());
    if (!this->isSmall()) std::free(this->begin());
    this->BeginX = RHS.BeginX;
    this->EndX = RHS.EndX;
    this->CapacityX = RHS.CapacityX;
    RHS.resetToSmall();
    return *this;
  }

  // If we already have sufficient space, assign the common elements, then
  // destroy any excess.
  size_t RHSSize = RHS.size();
  size_t CurSize = this->size();
  if (CurSize >= RHSSize) {
    // Assign common elements.
    iterator NewEnd = this->begin();
    if (RHSSize)
      NewEnd = std::move(RHS.begin(), RHS.end(), NewEnd);

    // Destroy excess elements and trim the bounds.
    this->destroy_range(NewEnd, this->end());
    this->setEnd(NewEnd);

    // Clear the RHS.
    RHS.clear();

    return *this;
  }

  // If we have to grow to have enough elements, destroy the current elements.
  // This allows us to avoid copying them during the grow.
  // FIXME: this may not actually make any sense if we can efficiently move
  // elements.
  if (this->capacity() < RHSSize) {
    // Destroy current elements.
    this->destroy_range(this->begin(), this->end());
    this->setEnd(this->begin());
    CurSize = 0;
    this->grow(RHSSize);
  } else if (CurSize) {
    // Otherwise, use assignment for the already-constructed elements.
    std::move(RHS.begin(), RHS.begin()+CurSize, this->begin());
  }

  // Move-construct the new elements in place.
  this->uninitialized_move(RHS.begin()+CurSize, RHS.end(),
                           this->begin()+CurSize);

  // Set end.
  this->setEnd(this->begin()+RHSSize);

  RHS.clear();
  return *this;
}